

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<char>::reallocateAndGrow
          (QArrayDataPointer<char> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<char> *old)

{
  QArrayData *pQVar1;
  bool bVar2;
  char *pcVar3;
  qsizetype qVar4;
  qsizetype toCopy;
  size_t __n;
  long in_FS_OFFSET;
  pair<QArrayData_*,_void_*> pVar5;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<char> *)0x0 && where == GrowsAtEnd) {
    pQVar1 = &this->d->super_QArrayData;
    if (pQVar1 == (QArrayData *)0x0) {
      bVar2 = true;
    }
    else {
      bVar2 = 1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar2)) {
      if (pQVar1 == (QArrayData *)0x0) {
        qVar4 = 0;
        pcVar3 = (char *)0x0;
      }
      else {
        qVar4 = pQVar1->alloc;
        pcVar3 = this->ptr +
                 (this->size -
                 (((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0) + pQVar1->alloc));
      }
      pVar5 = QArrayData::reallocateUnaligned
                        (pQVar1,this->ptr,1,(qsizetype)(pcVar3 + qVar4 + n),Grow);
      this->d = (Data *)pVar5.first;
      this->ptr = (char *)pVar5.second;
      goto LAB_00157c3e;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  if ((this->size != 0) && (__n = this->size + (n >> 0x3f & n), __n != 0)) {
    memcpy(local_48.ptr + local_48.size,this->ptr,__n);
    local_48.size = local_48.size + __n;
  }
  pQVar1 = &this->d->super_QArrayData;
  pcVar3 = this->ptr;
  this->d = local_48.d;
  this->ptr = local_48.ptr;
  qVar4 = this->size;
  this->size = local_48.size;
  local_48.d = (Data *)pQVar1;
  local_48.ptr = pcVar3;
  local_48.size = qVar4;
  if (old != (QArrayDataPointer<char> *)0x0) {
    local_48.d = old->d;
    local_48.ptr = old->ptr;
    old->d = (Data *)pQVar1;
    old->ptr = pcVar3;
    local_48.size = old->size;
    old->size = qVar4;
  }
  if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d)->super_QArrayData,1,0x10);
    }
  }
LAB_00157c3e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }